

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O2

void __thiscall deqp::egl::Image::ModifyTests::~ModifyTests(ModifyTests *this)

{
  ~ModifyTests(this);
  operator_delete(this,0xc90);
  return;
}

Assistant:

ModifyTests		(EglTestContext& eglTestCtx, const string& name, const string& desc)
									: ImageTests(eglTestCtx, name, desc) {}